

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

DeviceFeaturesVk
Diligent::PhysicalDeviceFeaturesToDeviceFeaturesVk
          (ExtensionFeatures *ExtFeatures,DEVICE_FEATURE_STATE OptionalState)

{
  Char *Message;
  char (*in_RCX) [47];
  DEVICE_FEATURE_STATE local_5a;
  DEVICE_FEATURE_STATE local_59;
  undefined1 local_40 [8];
  string msg;
  DEVICE_FEATURE_STATE OptionalState_local;
  ExtensionFeatures *ExtFeatures_local;
  DeviceFeaturesVk FeaturesVk;
  
  msg.field_2._M_local_buf[0xf] = OptionalState;
  if (OptionalState == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[26],char[47]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"OptionalState != DEVICE_FEATURE_STATE_DISABLED",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"PhysicalDeviceFeaturesToDeviceFeaturesVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x818);
    std::__cxx11::string::~string((string *)local_40);
  }
  DeviceFeaturesVk::DeviceFeaturesVk((DeviceFeaturesVk *)((long)&ExtFeatures_local + 6));
  if ((ExtFeatures->DynamicRendering).dynamicRendering == 0) {
    local_59 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_59 = msg.field_2._M_local_buf[0xf];
  }
  if ((ExtFeatures->HostImageCopy).hostImageCopy == 0) {
    local_5a = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_5a = msg.field_2._M_local_buf[0xf];
  }
  ExtFeatures_local._6_2_ = (DeviceFeaturesVk)CONCAT11(local_5a,local_59);
  return ExtFeatures_local._6_2_;
}

Assistant:

DeviceFeaturesVk PhysicalDeviceFeaturesToDeviceFeaturesVk(const VulkanUtilities::VulkanPhysicalDevice::ExtensionFeatures& ExtFeatures,
                                                          DEVICE_FEATURE_STATE                                            OptionalState)
{
    VERIFY_EXPR(OptionalState != DEVICE_FEATURE_STATE_DISABLED);

    DeviceFeaturesVk FeaturesVk;

#define INIT_FEATURE(FeatureName, Supported) \
    FeaturesVk.FeatureName = (Supported) ? OptionalState : DEVICE_FEATURE_STATE_DISABLED

    INIT_FEATURE(DynamicRendering, ExtFeatures.DynamicRendering.dynamicRendering != VK_FALSE);
    INIT_FEATURE(HostImageCopy, ExtFeatures.HostImageCopy.hostImageCopy != VK_FALSE);

#undef INIT_FEATURE

    ASSERT_SIZEOF(DeviceFeaturesVk, 2, "Did you add a new feature to DeviceFeaturesVk? Please handle its status here (if necessary).");

    return FeaturesVk;
}